

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_process_config_file(App *this)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  undefined8 uVar4;
  byte bVar5;
  Option *in_RDI;
  bool bVar6;
  bool force;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_file;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool files_used;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  config_files;
  string ename_string;
  bool file_given;
  bool config_required;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  Option *in_stack_ffffffffffffff00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff10;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b8;
  undefined1 *local_b0;
  undefined4 in_stack_ffffffffffffff58;
  undefined2 in_stack_ffffffffffffff5c;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  string *in_stack_ffffffffffffff60;
  App *in_stack_ffffffffffffff68;
  FileError *in_stack_ffffffffffffff70;
  undefined1 local_78 [24];
  Option *in_stack_ffffffffffffffa0;
  
  if (in_RDI[1].default_str_.field_2._M_allocated_capacity == 0) {
    return;
  }
  bVar1 = OptionBase<CLI::Option>::get_required
                    ((OptionBase<CLI::Option> *)in_RDI[1].default_str_.field_2._M_allocated_capacity
                    );
  sVar3 = Option::count((Option *)0x1b5e78);
  bVar6 = sVar3 != 0;
  if ((!bVar6) &&
     (bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x1b5eae), !bVar2)) {
    CLI::detail::get_environment_value
              ((string *)
               CONCAT17(in_stack_ffffffffffffff5f,
                        CONCAT16(in_stack_ffffffffffffff5e,
                                 CONCAT24(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58))));
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b5ee3
                      );
    if (!bVar2) {
      ::std::__cxx11::string::string(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      Option::add_result(in_stack_ffffffffffffff00,
                         (string *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      ::std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff00);
    }
    ::std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffff00);
  }
  Option::run_callback(in_stack_ffffffffffffffa0);
  Option::as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(in_RDI);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(in_stack_ffffffffffffff10);
  if (!bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_ffffffffffffff00);
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b5ff0
                      );
    if (!bVar2) {
      local_b0 = local_78;
      local_b8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
      while (bVar1 = __gnu_cxx::
                     operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_ffffffffffffff00,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8)),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        in_stack_ffffffffffffff00 =
             (Option *)
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_b8);
        in_stack_fffffffffffffeff =
             _process_config_file
                       (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                        (bool)in_stack_ffffffffffffff5f);
        if ((bool)in_stack_fffffffffffffeff) {
          bVar6 = true;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_b8);
      }
      if (!bVar6) {
        Option::clear(in_stack_ffffffffffffff00);
        bVar5 = *(byte *)(in_RDI[1].default_str_.field_2._M_allocated_capacity + 0x24e) & 1;
        *(undefined1 *)(in_RDI[1].default_str_.field_2._M_allocated_capacity + 0x24e) = 0;
        Option::run_callback(in_stack_ffffffffffffffa0);
        *(byte *)(in_RDI[1].default_str_.field_2._M_allocated_capacity + 0x24e) = bVar5 & 1;
      }
      goto LAB_001b621f;
    }
  }
  if (bVar1) {
    uVar4 = __cxa_allocate_exception(0x38);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    FileError::FileError(in_stack_ffffffffffffff70,(string *)in_stack_ffffffffffffff68);
    __cxa_throw(uVar4,&FileError::typeinfo,FileError::~FileError);
  }
LAB_001b621f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffff10);
  return;
}

Assistant:

CLI11_INLINE void App::_process_config_file() {
    if(config_ptr_ != nullptr) {
        bool config_required = config_ptr_->get_required();
        auto file_given = config_ptr_->count() > 0;
        if(!(file_given || config_ptr_->envname_.empty())) {
            std::string ename_string = detail::get_environment_value(config_ptr_->envname_);
            if(!ename_string.empty()) {
                config_ptr_->add_result(ename_string);
            }
        }
        config_ptr_->run_callback();

        auto config_files = config_ptr_->as<std::vector<std::string>>();
        bool files_used{file_given};
        if(config_files.empty() || config_files.front().empty()) {
            if(config_required) {
                throw FileError("config file is required but none was given");
            }
            return;
        }
        for(const auto &config_file : config_files) {
            if(_process_config_file(config_file, config_required || file_given)) {
                files_used = true;
            }
        }
        if(!files_used) {
            // this is done so the count shows as 0 if no callbacks were processed
            config_ptr_->clear();
            bool force = config_ptr_->force_callback_;
            config_ptr_->force_callback_ = false;
            config_ptr_->run_callback();
            config_ptr_->force_callback_ = force;
        }
    }
}